

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json_patch.c
# Opt level: O2

void test_json_patch_using_file(char *testdir,char *filename)

{
  FILE *__stream;
  long lVar1;
  ulong uVar2;
  json_object *jo;
  int *piVar3;
  undefined8 uVar4;
  ulong uVar5;
  char full_filename [4096];
  
  snprintf(full_filename,0x1000,"%s/%s",testdir,filename);
  printf("Testing using file %s\n",filename);
  lVar1 = json_object_from_file(full_filename);
  __stream = _stderr;
  if (lVar1 != 0) {
    uVar5 = 0;
    while( true ) {
      uVar2 = json_object_array_length(lVar1);
      if (uVar2 <= uVar5) break;
      jo = (json_object *)json_object_array_get_idx(lVar1,uVar5);
      test_json_patch_op(jo);
      uVar5 = uVar5 + 1;
    }
    json_object_put(lVar1);
    return;
  }
  piVar3 = __errno_location();
  uVar4 = _json_c_strerror(*piVar3);
  fprintf(__stream,"FAIL: unable to open %s: %s\n",full_filename,uVar4);
  exit(1);
}

Assistant:

void test_json_patch_using_file(const char *testdir, const char *filename)
{
	char full_filename[PATH_MAX];
	(void)snprintf(full_filename, sizeof(full_filename), "%s/%s", testdir, filename);
	size_t ii;

	printf("Testing using file %s\n", filename);
	json_object *jo = json_object_from_file(full_filename);
	if (!jo) {
		fprintf(stderr, "FAIL: unable to open %s: %s\n", full_filename, strerror(errno));
		exit(EXIT_FAILURE);
	}

	for (ii = 0; ii < json_object_array_length(jo); ii++) {
		struct json_object *jo1 = json_object_array_get_idx(jo, ii);
		test_json_patch_op(jo1);
	}

	json_object_put(jo);
}